

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayCopy(InternalAnalyzer *this,ArrayCopy *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  
  bVar2 = wasm::Type::isNull(&curr->destRef->type);
  if ((!bVar2) && (bVar2 = wasm::Type::isNull(&curr->srcRef->type), !bVar2)) {
    pEVar1 = this->parent;
    pEVar1->readsArray = true;
    pEVar1->writesArray = true;
    pEVar1->implicitTrap = true;
    return;
  }
  this->parent->trap = true;
  return;
}

Assistant:

void visitArrayCopy(ArrayCopy* curr) {
      if (curr->destRef->type.isNull() || curr->srcRef->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsArray = true;
      parent.writesArray = true;
      // traps when a ref is null, or when out of bounds.
      parent.implicitTrap = true;
    }